

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bytedata.cpp
# Opt level: O2

void __thiscall ByteData_Serialize_Test::TestBody(ByteData_Serialize_Test *this)

{
  bool bVar1;
  _Base_ptr p_Var2;
  uint16_t len;
  uint16_t len_00;
  uint16_t len_01;
  uint16_t len_02;
  uint16_t len_03;
  uint16_t len_04;
  uint16_t len_05;
  uint16_t len_06;
  uint16_t len_07;
  uint16_t len_08;
  uint16_t len_09;
  uint16_t len_10;
  long lVar3;
  char *pcVar4;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  allocator_type local_462;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_461;
  string local_460;
  ByteData data;
  AssertionResult gtest_ar;
  string local_400;
  ByteData serialized;
  string local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  string local_380;
  string local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  string local_320;
  string local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  string local_2c0;
  string local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  string local_260;
  string local_240;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  test_vector;
  AssertionResult gtest_ar_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[1],_const_char_(&)[3],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&gtest_ar_1,(char (*) [1])0x4d37ee,(char (*) [3])0x4b1421);
  TestBody()::$_0::operator()[abi_cxx11_(&local_460,(void *)0x1,len);
  TestBody()::$_0::operator()[abi_cxx11_((string *)&data,(void *)0x1,len_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&serialized,
                 "01",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&data);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_1b0,&local_460,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&serialized);
  TestBody()::$_0::operator()[abi_cxx11_(&local_400,(void *)0xfb,len_01);
  TestBody()::$_0::operator()[abi_cxx11_(&local_240,(void *)0xfb,len_02);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,"fb"
                 ,&local_240);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_170,&local_400,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  TestBody()::$_0::operator()[abi_cxx11_(&local_260,(void *)0xfc,len_03);
  TestBody()::$_0::operator()[abi_cxx11_(&local_2a0,(void *)0xfc,len_04);
  std::operator+(&local_280,"fc",&local_2a0);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_130,&local_260,&local_280);
  TestBody()::$_0::operator()[abi_cxx11_(&local_2c0,(void *)0xfd,len_05);
  TestBody()::$_0::operator()[abi_cxx11_(&local_300,(void *)0xfd,len_06);
  std::operator+(&local_2e0,"fdfd00",&local_300);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_f0,&local_2c0,&local_2e0);
  TestBody()::$_0::operator()[abi_cxx11_(&local_320,(void *)0xfffe,len_07);
  TestBody()::$_0::operator()[abi_cxx11_(&local_360,(void *)0xfffe,len_08);
  std::operator+(&local_340,"fdfeff",&local_360);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_b0,&local_320,&local_340);
  TestBody()::$_0::operator()[abi_cxx11_(&local_380,(void *)0xffff,len_09);
  TestBody()::$_0::operator()[abi_cxx11_(&local_3c0,(void *)0xffff,len_10);
  std::operator+(&local_3a0,"fdffff",&local_3c0);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_70,&local_380,&local_3a0);
  __l._M_len = 7;
  __l._M_array = (iterator)&gtest_ar_1;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&test_vector,__l,&local_461,&local_462);
  lVar3 = 0x180;
  do {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(&gtest_ar_1.success_ + lVar3));
    lVar3 = lVar3 + -0x40;
  } while (lVar3 != -0x40);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)&local_340);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_320);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_400);
  std::__cxx11::string::~string((string *)&serialized);
  std::__cxx11::string::~string((string *)&data);
  std::__cxx11::string::~string((string *)&local_460);
  cfd::core::ByteData::ByteData(&serialized);
  cfd::core::ByteData::ByteData(&data);
  for (p_Var2 = test_vector._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &test_vector._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        cfd::core::ByteData::ByteData((ByteData *)&gtest_ar_1,(string *)(p_Var2 + 1));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                  (&data.data_,(string *)&gtest_ar_1);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_1);
      }
    }
    else {
      testing::Message::Message((Message *)&gtest_ar_1);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_460,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_bytedata.cpp"
                 ,0x82,
                 "Expected: data = ByteData(citr->first) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_460,(Message *)&gtest_ar_1);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_460);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_1);
    }
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        cfd::core::ByteData::Serialize((ByteData *)&gtest_ar_1,&data);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                  (&serialized.data_,(string *)&gtest_ar_1);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_1);
      }
    }
    else {
      testing::Message::Message((Message *)&gtest_ar_1);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_460,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_bytedata.cpp"
                 ,0x83,
                 "Expected: serialized = data.Serialize() doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_460,(Message *)&gtest_ar_1);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_460);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_1);
    }
    cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar_1,&serialized);
    pcVar4 = (char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_);
    cfd::core::ByteData::ByteData((ByteData *)&local_400,(string *)(p_Var2 + 2));
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_460,(ByteData *)&local_400);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar,"serialized.GetHex().c_str()",
               "ByteData(citr->second).GetHex().c_str()",pcVar4,local_460._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_460);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_400);
    std::__cxx11::string::~string((string *)&gtest_ar_1);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_1);
      pcVar4 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_460,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_bytedata.cpp"
                 ,0x84,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_460,(Message *)&gtest_ar_1);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_460);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_1);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_460._M_dataplus._M_p = (pointer)cfd::core::ByteData::GetSerializeSize(&data);
    local_400._M_dataplus._M_p = (pointer)cfd::core::ByteData::GetDataSize(&serialized);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&gtest_ar_1,"data.GetSerializeSize()","serialized.GetDataSize()",
               (unsigned_long *)&local_460,(unsigned_long *)&local_400);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_460);
      pcVar4 = "";
      if (gtest_ar_1.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_400,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_bytedata.cpp"
                 ,0x85,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_400,(Message *)&local_460);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_400);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_460);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&serialized);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&test_vector._M_t);
  return;
}

Assistant:

TEST(ByteData, Serialize) {
  auto blank_str = [](uint16_t len){
    std::string ret;
    ret.reserve(len*2);
    ret.resize(len*2, '0');
    return ret;
  };

  // FIXME(fujita-cg):  32/64byte長については、capasityの限界によりテスト不可
  //                    capasityが解決したらテストを修正する
  const uint64_t vi_max8 = 252;
  const uint64_t vi_max16 = std::numeric_limits<uint16_t>::max();
  // const uint64_t vi_max32 = std::numeric_limits<uint32_t>::max();
  // const uint64_t vi_max64 = std::numeric_limits<uint64_t>::max();
  std::map<std::string, std::string> test_vector = {
    {"", "00"},
    {blank_str(1), "01" + blank_str(1)},
    {blank_str(vi_max8-1), ("fb" + blank_str(vi_max8-1))},
    {blank_str(vi_max8), ("fc" + blank_str(vi_max8))},
    {blank_str(vi_max8+1), ("fdfd00" + blank_str(vi_max8+1))},
    {blank_str(vi_max16-1), ("fdfeff" + blank_str(vi_max16-1))},
    {blank_str(vi_max16), ("fdffff" + blank_str(vi_max16))},
    // {blank_str(vi_max16+1), ("fe00000100" + blank_str(vi_max16+1))},
    // {blank_str(vi_max32-1), ("fefeffffff" + blank_str(vi_max32-1))},
    // {blank_str(vi_max32), ("feffffffff" + blank_str(vi_max32))},
    // {blank_str(vi_max32+1), ("ff0000000001000000" + blank_str(vi_max32+1))},
    // {blank_str(vi_max64-1), ("fffeffffffffffffff" + blank_str(vi_max64-1))},
    // {blank_str(vi_max64), ("ffffffffffffffffff" + blank_str(vi_max64))},
  };

  ByteData serialized;
  ByteData data;
  decltype(test_vector)::const_iterator citr = test_vector.cbegin();
  while (citr != test_vector.cend()) {
    EXPECT_NO_THROW(data = ByteData(citr->first));
    EXPECT_NO_THROW(serialized = data.Serialize());
    EXPECT_STREQ(serialized.GetHex().c_str(), ByteData(citr->second).GetHex().c_str());
    EXPECT_EQ(data.GetSerializeSize(), serialized.GetDataSize());
    ++citr;
  }
}